

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonIterativeFeaturePreservingMeshFiltering.cpp
# Opt level: O2

void __thiscall
NonIterativeFeaturePreservingMeshFiltering::initParameters
          (NonIterativeFeaturePreservingMeshFiltering *this)

{
  ParameterSet *pPVar1;
  string local_40;
  allocator local_19;
  
  ParameterSet::removeAllParameter((this->super_MeshDenoisingBase).parameter_set_);
  pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
  std::__cxx11::string::string((string *)&local_40,"sigma_f/mean_edge_length",&local_19);
  ParameterSet::addParameter(pPVar1,&local_40,1.0);
  std::__cxx11::string::~string((string *)&local_40);
  pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
  std::__cxx11::string::string((string *)&local_40,"sigma_g/mean_edge_length",&local_19);
  ParameterSet::addParameter(pPVar1,&local_40,1.0);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void NonIterativeFeaturePreservingMeshFiltering::initParameters()
{
    parameter_set_->removeAllParameter();
    parameter_set_->addParameter(string("sigma_f/mean_edge_length"), 1.0);
    parameter_set_->addParameter(string("sigma_g/mean_edge_length"), 1.0);

}